

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall
arangodb::velocypack::Buffer<unsigned_char>::grow(Buffer<unsigned_char> *this,ValueLength len)

{
  ValueLength VVar1;
  Buffer<unsigned_char> *this_00;
  long in_RSI;
  Buffer<unsigned_char> *in_RDI;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uchar *p;
  double growthFactor;
  ValueLength newLen;
  size_t local_30;
  
  local_30 = in_RDI->_size + in_RSI;
  auVar4._8_4_ = (int)(local_30 >> 0x20);
  auVar4._0_8_ = local_30;
  auVar4._12_4_ = 0x45300000;
  VVar1 = in_RDI->_size;
  auVar5._8_4_ = (int)(VVar1 >> 0x20);
  auVar5._0_8_ = VVar1;
  auVar5._12_4_ = 0x45300000;
  if ((auVar4._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0) <
      ((auVar5._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)VVar1) - 4503599627370496.0)) * 1.5) {
    VVar1 = in_RDI->_size;
    auVar3._8_4_ = (int)(VVar1 >> 0x20);
    auVar3._0_8_ = VVar1;
    auVar3._12_4_ = 0x45300000;
    dVar2 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)VVar1) - 4503599627370496.0)) * 1.5;
    local_30 = (size_t)dVar2;
    local_30 = local_30 | (long)(dVar2 - 9.223372036854776e+18) & (long)local_30 >> 0x3f;
  }
  if (in_RDI->_buffer == in_RDI->_local) {
    this_00 = (Buffer<unsigned_char> *)malloc(local_30);
    ensureValidPointer(this_00,(uchar *)in_RDI);
    memcpy(this_00,in_RDI->_buffer,in_RDI->_size);
  }
  else {
    this_00 = (Buffer<unsigned_char> *)realloc(in_RDI->_buffer,local_30);
    ensureValidPointer(this_00,(uchar *)in_RDI);
  }
  poison(in_RDI,this_00->_local + (in_RDI->_capacity - 0x18),local_30 - in_RDI->_capacity);
  in_RDI->_buffer = (uchar *)this_00;
  in_RDI->_capacity = local_30;
  return;
}

Assistant:

void grow(ValueLength len) {
    VELOCYPACK_ASSERT(_size + len >= sizeof(_local));

    // need reallocation
    ValueLength newLen = _size + len;
    constexpr double growthFactor = 1.5;
    if (newLen < growthFactor * _size) {
      // ensure the buffer grows sensibly and not by 1 byte only
      newLen = static_cast<ValueLength>(growthFactor * _size);
    }
    VELOCYPACK_ASSERT(newLen > _size);

    // intentionally do not initialize memory here
    // intentionally also do not care about alignments here, as we
    // expect T to be 1-byte-aignable
    VELOCYPACK_ASSERT(newLen > 0);
    T* p;
    if (_buffer != _local) {
      p = static_cast<T*>(velocypack_realloc(_buffer, checkOverflow(newLen)));
      ensureValidPointer(p);
      // realloc will have copied the old data
    } else {
      p = static_cast<T*>(velocypack_malloc(checkOverflow(newLen)));
      ensureValidPointer(p);
      // copy existing data into buffer
      memcpy(p, _buffer, checkOverflow(_size));
    }
    poison(p + _capacity, newLen - _capacity);

    _buffer = p;
    _capacity = newLen;

    VELOCYPACK_ASSERT(_size <= _capacity);
  }